

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O1

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true>::set_paging<4>
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)1,_true> *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  
  lVar4 = 0;
  puVar6 = (pointer)0x0;
  if (((this->auxiliary_switches_).card_state_.region_C1_C3 & 1U) != 0) {
    puVar6 = (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  bVar1 = (this->auxiliary_switches_).card_state_.region_C3;
  bVar2 = (this->auxiliary_switches_).card_state_.region_C4_C8;
  bVar3 = (this->auxiliary_switches_).card_state_.region_C8_D0;
  do {
    this->read_pages_[lVar4 + 0xc1] = puVar6;
    if (puVar6 != (pointer)0x0) {
      puVar6 = puVar6 + 0x100;
    }
    this->write_pages_[lVar4 + 0xc1] = (uint8_t *)0x0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  puVar6 = (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar7 = (pointer)0x0;
  puVar5 = puVar6 + 0x200;
  if ((bVar1 & 1U) == 0) {
    puVar5 = puVar7;
  }
  this->read_pages_[0xc3] = puVar5;
  puVar6 = puVar6 + 0x300;
  if ((bVar2 & 1U) == 0) {
    puVar6 = puVar7;
  }
  do {
    this->read_pages_[(long)(puVar7 + 0xc4)] = puVar6;
    if (puVar6 != (pointer)0x0) {
      puVar6 = puVar6 + 0x100;
    }
    this->write_pages_[(long)(puVar7 + 0xc4)] = (uint8_t *)0x0;
    puVar7 = puVar7 + 1;
  } while (puVar7 != (pointer)0x4);
  puVar5 = (pointer)0x0;
  puVar6 = (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start + 0x700;
  if ((bVar3 & 1U) == 0) {
    puVar6 = puVar5;
  }
  do {
    this->read_pages_[(long)(puVar5 + 200)] = puVar6;
    if (puVar6 != (pointer)0x0) {
      puVar6 = puVar6 + 0x100;
    }
    this->write_pages_[(long)(puVar5 + 200)] = (uint8_t *)0x0;
    puVar5 = puVar5 + 1;
  } while (puVar5 != (pointer)0x8);
  return;
}

Assistant:

void set_paging() {
			if constexpr (bool(type & PagingType::ZeroPage)) {
				if(auxiliary_switches_.zero_state()) {
					write_pages_[0] = aux_ram_;
				} else {
					write_pages_[0] = ram_;
				}
				write_pages_[1] = write_pages_[0] + 256;
				read_pages_[0] = write_pages_[0];
				read_pages_[1] = write_pages_[1];
			}

			if constexpr (bool(type & (PagingType::LanguageCard | PagingType::ZeroPage))) {
				const auto language_state = language_card_.state();
				const auto zero_state = auxiliary_switches_.zero_state();

				uint8_t *const ram = zero_state ? aux_ram_ : ram_;
				uint8_t *const rom = is_iie(model) ? &rom_[3840] : rom_.data();

				// Which way the region here is mapped to be banks 1 and 2 is
				// arbitrary.
				page(0xd0, 0xe0,
					language_state.read ? &ram[language_state.bank2 ? 0xd000 : 0xc000] : rom,
					language_state.write ? nullptr : &ram[language_state.bank2 ? 0xd000 : 0xc000]);

				page(0xe0, 0x100,
					language_state.read ? &ram[0xe000] : &rom[0x1000],
					language_state.write ? nullptr : &ram[0xe000]);
			}

			if constexpr (bool(type & PagingType::CardArea)) {
				const auto state = auxiliary_switches_.card_state();

				page(0xc1, 0xc4, state.region_C1_C3 ? &rom_[0xc100 - 0xc100] : nullptr, nullptr);
				read_pages_[0xc3] = state.region_C3 ? &rom_[0xc300 - 0xc100] : nullptr;
				page(0xc4, 0xc8, state.region_C4_C8 ? &rom_[0xc400 - 0xc100] : nullptr, nullptr);
				page(0xc8, 0xd0, state.region_C8_D0 ? &rom_[0xc800 - 0xc100] : nullptr, nullptr);
			}

			if constexpr (bool(type & PagingType::Main)) {
				const auto state = auxiliary_switches_.main_state();

				page(0x02, 0x04,
					state.base.read ? &aux_ram_[0x0200] : &ram_[0x0200],
					state.base.write ? &aux_ram_[0x0200] : &ram_[0x0200]);
				page(0x08, 0x20,
					state.base.read ? &aux_ram_[0x0800] : &ram_[0x0800],
					state.base.write ? &aux_ram_[0x0800] : &ram_[0x0800]);
				page(0x40, 0xc0,
					state.base.read ? &aux_ram_[0x4000] : &ram_[0x4000],
					state.base.write ? &aux_ram_[0x4000] : &ram_[0x4000]);

				page(0x04, 0x08,
					state.region_04_08.read ? &aux_ram_[0x0400] : &ram_[0x0400],
					state.region_04_08.write ? &aux_ram_[0x0400] : &ram_[0x0400]);

				page(0x20, 0x40,
					state.region_20_40.read ? &aux_ram_[0x2000] : &ram_[0x2000],
					state.region_20_40.write ? &aux_ram_[0x2000] : &ram_[0x2000]);
			}
		}